

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O1

Info * __thiscall wabt::Opcode::GetInfo(Info *__return_storage_ptr__,Opcode *this)

{
  Enum EVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined3 uVar8;
  uint uVar9;
  long lVar10;
  
  uVar4 = infos_._26360_8_;
  EVar1 = this->enum_;
  if ((ulong)EVar1 < 0x1d6) {
    lVar10 = (ulong)EVar1 * 0x38;
    *(undefined8 *)&__return_storage_ptr__->prefix_code = *(undefined8 *)(infos_ + lVar10 + 0x30);
    pcVar2 = *(char **)(infos_ + lVar10);
    pcVar3 = *(char **)(infos_ + lVar10 + 8);
    uVar4 = *(undefined8 *)(infos_ + lVar10 + 0x10);
    uVar5 = *(undefined8 *)(infos_ + lVar10 + 0x18);
    uVar6 = *(undefined8 *)(infos_ + lVar10 + 0x28);
    __return_storage_ptr__->memory_size = *(Address *)(infos_ + lVar10 + 0x20);
    __return_storage_ptr__->prefix = (char)uVar6;
    *(int3 *)&__return_storage_ptr__->field_0x29 = (int3)((ulong)uVar6 >> 8);
    __return_storage_ptr__->code = (int)((ulong)uVar6 >> 0x20);
    __return_storage_ptr__->result_type = (Type)(int)uVar4;
    __return_storage_ptr__->param_types[0] = (Type)(int)((ulong)uVar4 >> 0x20);
    *(undefined8 *)(__return_storage_ptr__->param_types + 1) = uVar5;
    __return_storage_ptr__->name = pcVar2;
    __return_storage_ptr__->decomp = pcVar3;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->memory_size = infos_._26352_8_;
  uVar5 = infos_._26360_8_;
  infos_[0x66f8] = (undefined1)uVar4;
  infos_._26361_3_ = SUB83(uVar4,1);
  uVar8 = infos_._26361_3_;
  infos_._26364_4_ = SUB84(uVar4,4);
  uVar7 = infos_._26364_4_;
  __return_storage_ptr__->prefix = infos_[0x66f8];
  infos_._26360_8_ = uVar5;
  *(undefined3 *)&__return_storage_ptr__->field_0x29 = uVar8;
  __return_storage_ptr__->code = uVar7;
  *(undefined8 *)&__return_storage_ptr__->prefix_code = infos_._26368_8_;
  uVar4 = infos_._26344_8_;
  uVar7 = infos_._26340_4_;
  __return_storage_ptr__->result_type = (Type)infos_._26336_4_;
  __return_storage_ptr__->param_types[0] = (Type)uVar7;
  *(undefined8 *)(__return_storage_ptr__->param_types + 1) = uVar4;
  uVar4 = infos_._26328_8_;
  __return_storage_ptr__->name = (char *)infos_._26320_8_;
  __return_storage_ptr__->decomp = (char *)uVar4;
  uVar9 = -EVar1;
  __return_storage_ptr__->prefix = (uint8_t)(uVar9 >> 8);
  __return_storage_ptr__->code = uVar9 & 0xff;
  __return_storage_ptr__->prefix_code = uVar9 & 0xffff;
  return __return_storage_ptr__;
}

Assistant:

Opcode::Info Opcode::GetInfo() const {
  if (enum_ < Invalid) {
    return infos_[enum_];
  }

  Info invalid_info = infos_[Opcode::Invalid];
  DecodeInvalidOpcode(enum_, &invalid_info.prefix, &invalid_info.code);
  invalid_info.prefix_code = PrefixCode(invalid_info.prefix, invalid_info.code);
  return invalid_info;
}